

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O0

void __thiscall QTeamCityLogger::stopLogging(QTeamCityLogger *this)

{
  long lVar1;
  char *pcVar2;
  QAbstractTestLogger *this_00;
  QAbstractTestLogger *in_RDI;
  long in_FS_OFFSET;
  QTestCharBuffer buf;
  QTestCharBuffer *in_stack_fffffffffffffda0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset((QTestCharBuffer *)&stack0xfffffffffffffde8,0xaa,0x210);
  QTestCharBuffer::QTestCharBuffer((QTestCharBuffer *)&stack0xfffffffffffffde8);
  pcVar2 = QTestCharBuffer::constData((QTestCharBuffer *)(in_RDI + 0x43));
  this_00 = (QAbstractTestLogger *)QTestCharBuffer::constData((QTestCharBuffer *)(in_RDI + 0x43));
  QTest::qt_asprintf((QTestCharBuffer *)&stack0xfffffffffffffde8,
                     "##teamcity[testSuiteFinished name=\'%s\' flowId=\'%s\']\n",pcVar2,this_00);
  pcVar2 = QTestCharBuffer::constData((QTestCharBuffer *)&stack0xfffffffffffffde8);
  QAbstractTestLogger::outputString(this_00,pcVar2);
  QAbstractTestLogger::stopLogging(in_RDI);
  QTestCharBuffer::~QTestCharBuffer(in_stack_fffffffffffffda0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTeamCityLogger::stopLogging()
{
    QTestCharBuffer buf;
    QTest::qt_asprintf(&buf, "##teamcity[testSuiteFinished name='%s' flowId='%s']\n",
                       flowID.constData(), flowID.constData());
    outputString(buf.constData());

    QAbstractTestLogger::stopLogging();
}